

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O2

void Handlers::Trade_Add(Character *character,PacketReader *reader)

{
  bool bVar1;
  unsigned_short item;
  uint amount;
  int iVar2;
  EIF_Data *pEVar3;
  _List_node_base *p_Var4;
  list<Character_Item,_std::allocator<Character_Item>_> *plVar5;
  PacketBuilder builder;
  
  if (character->trading == true) {
    item = PacketReader::GetShort(reader);
    amount = PacketReader::GetInt(reader);
    pEVar3 = EIF::Get(character->world->eif,(uint)item);
    if (pEVar3->special != Lore) {
      plVar5 = &character->trade_inventory;
      p_Var4 = (_List_node_base *)plVar5;
      do {
        p_Var4 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var4->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var4 == (_List_node_base *)plVar5) {
          if (9 < (character->trade_inventory).
                  super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
                  _M_size) {
            return;
          }
          break;
        }
      } while ((int)*(short *)&p_Var4[1]._M_next != (uint)item);
      bVar1 = Character::AddTradeItem(character,item,amount);
      if (bVar1) {
        character->trade_agree = false;
        character->trade_partner->trade_agree = false;
        PacketBuilder::PacketBuilder
                  (&builder,PACKET_TRADE,PACKET_REPLY,
                   ((character->trade_partner->trade_inventory).
                    super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                    _M_node._M_size +
                   (character->trade_inventory).
                   super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node
                   ._M_size) * 6 + 6);
        iVar2 = Character::PlayerID(character);
        PacketBuilder::AddShort(&builder,iVar2);
        p_Var4 = (_List_node_base *)plVar5;
        while (p_Var4 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                         &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)plVar5) {
          iVar2 = *(int *)((long)&p_Var4[1]._M_next + 4);
          PacketBuilder::AddShort(&builder,(int)*(short *)&p_Var4[1]._M_next);
          PacketBuilder::AddInt(&builder,iVar2);
        }
        PacketBuilder::AddByte(&builder,0xff);
        iVar2 = Character::PlayerID(character->trade_partner);
        PacketBuilder::AddShort(&builder,iVar2);
        plVar5 = &character->trade_partner->trade_inventory;
        p_Var4 = (_List_node_base *)plVar5;
        while (p_Var4 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                         &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)plVar5) {
          iVar2 = *(int *)((long)&p_Var4[1]._M_next + 4);
          PacketBuilder::AddShort(&builder,(int)*(short *)&p_Var4[1]._M_next);
          PacketBuilder::AddInt(&builder,iVar2);
        }
        PacketBuilder::AddByte(&builder,0xff);
        Character::Send(character,&builder);
        Character::Send(character->trade_partner,&builder);
        PacketBuilder::~PacketBuilder(&builder);
      }
    }
  }
  return;
}

Assistant:

void Trade_Add(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	int itemid = reader.GetShort();
	int amount = reader.GetInt();

	if (character->world->eif->Get(itemid).special == EIF::Lore)
	{
		return;
	}

	bool offered = false;
	UTIL_FOREACH(character->trade_inventory, item)
	{
		if (item.id == itemid)
		{
			offered = true;
			break;
		}
	}

	if (!offered && character->trade_inventory.size() >= 10)
	{
		return;
	}

	if (character->AddTradeItem(itemid, amount))
	{
		character->trade_agree = false;
		character->trade_partner->trade_agree = false;

		PacketBuilder builder(PACKET_TRADE, PACKET_REPLY,
			6 + character->trade_inventory.size() * 6 + character->trade_partner->trade_inventory.size() * 6);

		builder.AddShort(character->PlayerID());
		UTIL_FOREACH(character->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		builder.AddShort(character->trade_partner->PlayerID());
		UTIL_FOREACH(character->trade_partner->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		character->Send(builder);
		character->trade_partner->Send(builder);
	}
}